

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O1

string * __thiscall
cmLocalNinjaGenerator::WriteCommandScript
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmdLines,string *outputConfig,string *commandConfig,string *customStep,
          cmGeneratorTarget *target)

{
  cmGlobalGenerator *pcVar1;
  pointer pbVar2;
  pointer pcVar3;
  int iVar4;
  string *psVar5;
  ostream *poVar6;
  pointer pbVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  ofstream script;
  string local_280;
  string local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  string *local_238;
  undefined1 local_230 [8];
  pointer local_228;
  undefined1 local_220 [232];
  ios_base local_138 [264];
  
  local_240 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_240;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_238 = commandConfig;
  if (target == (cmGeneratorTarget *)0x0) {
    psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    local_228 = (psVar5->_M_dataplus)._M_p;
    local_230 = (undefined1  [8])psVar5->_M_string_length;
    local_220._0_8_ = 0xb;
    local_220._8_8_ = "/CMakeFiles";
    views._M_len = 2;
    views._M_array = (iterator)local_230;
    cmCatViews_abi_cxx11_(&local_280,views);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_280);
    uVar8 = local_280.field_2._M_allocated_capacity;
    _Var9._M_p = local_280._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p == &local_280.field_2) goto LAB_00386390;
  }
  else {
    cmGeneratorTarget::GetSupportDirectory_abi_cxx11_((string *)local_230,target);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_230);
    uVar8 = local_220._0_8_;
    _Var9._M_p = (pointer)local_230;
    if (local_230 == (undefined1  [8])local_220) goto LAB_00386390;
  }
  operator_delete(_Var9._M_p,uVar8 + 1);
LAB_00386390:
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  (*pcVar1->_vptr_cmGlobalGenerator[0x49])(local_230,pcVar1,outputConfig);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_230);
  if (local_230 != (undefined1  [8])local_220) {
    operator_delete((void *)local_230,local_220._0_8_ + 1);
  }
  cmsys::SystemTools::MakeDirectory(__return_storage_ptr__,(mode_t *)0x0);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(customStep->_M_dataplus)._M_p);
  iVar4 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[0x26])();
  if ((char)iVar4 != '\0') {
    local_230 = (undefined1  [8])&DAT_00000001;
    local_220[0] = 0x2d;
    local_280.field_2._8_8_ = (local_238->_M_dataplus)._M_p;
    local_280.field_2._M_allocated_capacity = local_238->_M_string_length;
    local_280._M_dataplus._M_p = &DAT_00000001;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_280;
    local_280._M_string_length = (size_type)local_220;
    local_228 = local_220;
    cmCatViews_abi_cxx11_(&local_260,views_00);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,
               CONCAT71(local_260._M_dataplus._M_p._1_7_,local_260._M_dataplus._M_p._0_1_));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_260._M_dataplus._M_p._1_7_,local_260._M_dataplus._M_p._0_1_) !=
        &local_260.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_260._M_dataplus._M_p._1_7_,local_260._M_dataplus._M_p._0_1_),
                      local_260.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::ofstream::ofstream(local_230,(__return_storage_ptr__->_M_dataplus)._M_p,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"set -e\n\n",8);
  pbVar7 = (cmdLines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (cmdLines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 != pbVar2) {
    do {
      pcVar3 = (pbVar7->_M_dataplus)._M_p;
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_280,pcVar3,pcVar3 + pbVar7->_M_string_length);
      cmsys::SystemTools::ReplaceString(&local_280,"$$","$");
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_230,local_280._M_dataplus._M_p,local_280._M_string_length
                         );
      local_260._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_260,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar2);
  }
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _EVP_PKEY_get_bn_param;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::WriteCommandScript(
  std::vector<std::string> const& cmdLines, std::string const& outputConfig,
  std::string const& commandConfig, std::string const& customStep,
  cmGeneratorTarget const* target) const
{
  std::string scriptPath;
  if (target) {
    scriptPath = target->GetSupportDirectory();
  } else {
    scriptPath = cmStrCat(this->GetCurrentBinaryDirectory(), "/CMakeFiles");
  }
  scriptPath += this->GetGlobalNinjaGenerator()->ConfigDirectory(outputConfig);
  cmSystemTools::MakeDirectory(scriptPath);
  scriptPath += '/';
  scriptPath += customStep;
  if (this->GlobalGenerator->IsMultiConfig()) {
    scriptPath += cmStrCat('-', commandConfig);
  }
#ifdef _WIN32
  scriptPath += ".bat";
#else
  scriptPath += ".sh";
#endif

  cmsys::ofstream script(scriptPath.c_str());

#ifdef _WIN32
  script << "@echo off\n";
  int line = 1;
#else
  script << "set -e\n\n";
#endif

  for (auto const& i : cmdLines) {
    std::string cmd = i;
    // The command line was built assuming it would be written to
    // the build.ninja file, so it uses '$$' for '$'.  Remove this
    // for the raw shell script.
    cmSystemTools::ReplaceString(cmd, "$$", "$");
#ifdef _WIN32
    script << cmd << " || (set FAIL_LINE=" << ++line << "& goto :ABORT)"
           << '\n';
#else
    script << cmd << '\n';
#endif
  }

#ifdef _WIN32
  script << "goto :EOF\n\n"
            ":ABORT\n"
            "set ERROR_CODE=%ERRORLEVEL%\n"
            "echo Batch file failed at line %FAIL_LINE% "
            "with errorcode %ERRORLEVEL%\n"
            "exit /b %ERROR_CODE%";
#endif

  return scriptPath;
}